

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::SpectrumHandle::ParameterString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumHandle *this)

{
  ulong uVar1;
  uint uVar2;
  RGBSpectrum *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ).bits;
  uVar2 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    if (uVar1 >> 0x31 == 0) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.cpp"
               ,0xc6,"Shouldn\'t be called");
    }
    if (uVar2 == 2) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.cpp"
               ,0xda,"Shouldn\'t be called");
    }
    PiecewiseLinearSpectrum::ParameterString_abi_cxx11_
              (__return_storage_ptr__,(PiecewiseLinearSpectrum *)(uVar1 & 0xffffffffffff));
  }
  else {
    uVar2 = uVar2 - 3;
    this_00 = (RGBSpectrum *)(uVar1 & 0xffffffffffff);
    if (uVar2 < 2) {
      RGBSpectrum::ParameterString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
    else if (uVar2 == 2) {
      RGBReflectanceSpectrum::ParameterString_abi_cxx11_
                (__return_storage_ptr__,(RGBReflectanceSpectrum *)this_00);
    }
    else {
      BlackbodySpectrum::ParameterString_abi_cxx11_
                (__return_storage_ptr__,(BlackbodySpectrum *)this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumHandle::ParameterString() const {
    auto ps = [&](auto ptr) { return ptr->ParameterString(); };
    return DispatchCPU(ps);
}